

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.h
# Opt level: O1

void __thiscall trun::TestResponseProxy::TestResponseProxy(TestResponseProxy *this)

{
  this->_vptr_TestResponseProxy = (_func_int **)&PTR__TestResponseProxy_002266d0;
  Timer::Timer(&this->timer);
  (this->assertError)._vptr_AssertError = (_func_int **)&PTR__AssertError_00226700;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->assertError).assertErrors.
           super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->assertError).assertErrors.
           super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->exceptionString)._M_dataplus._M_p = (pointer)&(this->exceptionString).field_2;
  (this->exceptionString)._M_string_length = 0;
  (this->exceptionString).field_2._M_local_buf[0] = '\0';
  this->testResult = kTestResult_Pass;
  this->assertCount = 0;
  this->errorCount = 0;
  (this->symbolName)._M_dataplus._M_p = (pointer)&(this->symbolName).field_2;
  (this->symbolName)._M_string_length = 0;
  (this->symbolName).field_2._M_local_buf[0] = '\0';
  (this->moduleName)._M_dataplus._M_p = (pointer)&(this->moduleName).field_2;
  (this->moduleName)._M_string_length = 0;
  (this->moduleName).field_2._M_local_buf[0] = '\0';
  this->pLogger = (ILogger *)0x0;
  return;
}

Assistant:

TestResponseProxy() = default;